

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O2

Vector<float,_2>
deqp::gles2::Functional::(anonymous_namespace)::convertToTypeVec<float,2,float,4>
          (Vector<float,_4> *v)

{
  Vector<float,_2> VVar1;
  int ndx;
  long lVar2;
  Vector<float,_2> *retVal;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  
  *in_RDI = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    in_XMM0_Da = v->m_data[lVar2];
    in_XMM0_Db = 0.0;
    *(float *)((long)in_RDI + lVar2 * 4) = in_XMM0_Da;
  }
  VVar1.m_data[1] = in_XMM0_Db;
  VVar1.m_data[0] = in_XMM0_Da;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}